

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O2

void bmpmask32toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  OPJ_UINT8 *pOVar9;
  OPJ_UINT32 alphaPrec;
  OPJ_UINT32 alphaShift;
  OPJ_UINT32 bluePrec;
  OPJ_UINT32 blueShift;
  OPJ_UINT32 greenPrec;
  OPJ_UINT32 greenShift;
  OPJ_UINT32 redPrec;
  OPJ_UINT32 redShift;
  OPJ_UINT32 local_70;
  byte local_6c [4];
  OPJ_UINT32 local_68;
  byte local_64 [4];
  OPJ_UINT32 local_60;
  byte local_5c [4];
  OPJ_UINT32 local_58;
  byte local_54 [4];
  ulong local_50;
  ulong local_48;
  
  poVar2 = image->comps;
  local_50 = (ulong)poVar2->w;
  local_48 = (ulong)poVar2->h;
  uVar1 = image->numcomps;
  bmp_mask_get_shift_and_prec(redMask,(OPJ_UINT32 *)local_54,&local_58);
  bmp_mask_get_shift_and_prec(greenMask,(OPJ_UINT32 *)local_5c,&local_60);
  bmp_mask_get_shift_and_prec(blueMask,(OPJ_UINT32 *)local_64,&local_68);
  bmp_mask_get_shift_and_prec(alphaMask,(OPJ_UINT32 *)local_6c,&local_70);
  poVar2->bpp = local_58;
  poVar2->prec = local_58;
  poVar2[1].bpp = local_60;
  poVar2[1].prec = local_60;
  poVar2[2].bpp = local_68;
  poVar2[2].prec = local_68;
  if (3 < uVar1) {
    poVar2[3].bpp = local_70;
    poVar2[3].prec = local_70;
  }
  pOVar9 = pData + ((int)local_48 + -1) * stride;
  lVar4 = 0;
  for (iVar3 = 0; iVar3 != (int)local_48; iVar3 = iVar3 + 1) {
    iVar5 = (int)lVar4;
    lVar4 = local_50 + (long)iVar5;
    lVar7 = (long)iVar5 * 4;
    for (uVar8 = 0; local_50 * 4 - uVar8 != 0; uVar8 = uVar8 + 4) {
      iVar5 = (int)uVar8;
      uVar6 = CONCAT13(pOVar9[iVar5 + 3],
                       CONCAT12(pOVar9[iVar5 + 2],
                                CONCAT11(pOVar9[iVar5 + 1],pOVar9[uVar8 & 0xffffffff])));
      *(uint *)((long)poVar2->data + uVar8 + lVar7) = (uVar6 & redMask) >> (local_54[0] & 0x1f);
      *(uint *)((long)poVar2[1].data + uVar8 + lVar7) = (uVar6 & greenMask) >> (local_5c[0] & 0x1f);
      *(uint *)((long)poVar2[2].data + uVar8 + lVar7) = (uVar6 & blueMask) >> (local_64[0] & 0x1f);
      if (3 < uVar1) {
        *(uint *)((long)poVar2[3].data + uVar8 + lVar7) =
             (uVar6 & alphaMask) >> (local_6c[0] & 0x1f);
      }
    }
    pOVar9 = pOVar9 + -(ulong)stride;
  }
  return;
}

Assistant:

static void bmpmask32toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].bpp = redPrec;
    image->comps[0].prec = redPrec;
    image->comps[1].bpp = greenPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].bpp = bluePrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].bpp = alphaPrec;
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[4 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[4 * x + 1]) <<  8;
            value |= ((OPJ_UINT32)pSrc[4 * x + 2]) << 16;
            value |= ((OPJ_UINT32)pSrc[4 * x + 3]) << 24;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}